

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Normal3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Normal3f *n,Float time)

{
  Tuple3<pbrt::Normal3,_float> TVar1;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Normal3<float> NVar6;
  Normal3<float> *in_stack_00000018;
  Transform *in_stack_00000020;
  Transform t;
  Float in_stack_0000024c;
  AnimatedTransform *in_stack_00000250;
  undefined8 local_c;
  undefined4 local_4;
  undefined1 auVar5 [56];
  
  auVar5 = in_ZMM0._8_56_;
  if (((*(byte *)(in_RDI + 0x108) & 1) == 0) ||
     (auVar5 = (undefined1  [56])0x0, in_ZMM0._0_4_ <= *(float *)(in_RDI + 0x100))) {
    NVar6 = Transform::operator()(in_stack_00000020,in_stack_00000018);
    local_4 = NVar6.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar2._0_8_ = NVar6.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar2._8_56_ = auVar5;
    local_c = vmovlpd_avx(auVar2._0_16_);
  }
  else {
    auVar5 = (undefined1  [56])0x0;
    if (in_ZMM0._0_4_ < *(float *)(in_RDI + 0x104)) {
      auVar5 = (undefined1  [56])0x0;
      Interpolate(in_stack_00000250,in_stack_0000024c);
      NVar6 = Transform::operator()(in_stack_00000020,in_stack_00000018);
      local_4 = NVar6.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar4._0_8_ = NVar6.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar4._8_56_ = auVar5;
      local_c = vmovlpd_avx(auVar4._0_16_);
    }
    else {
      NVar6 = Transform::operator()(in_stack_00000020,in_stack_00000018);
      local_4 = NVar6.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar3._0_8_ = NVar6.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar3._8_56_ = auVar5;
      local_c = vmovlpd_avx(auVar3._0_16_);
    }
  }
  TVar1.z = local_4;
  TVar1.x = (float)(undefined4)local_c;
  TVar1.y = (float)local_c._4_4_;
  return (Normal3f)TVar1;
}

Assistant:

Normal3f AnimatedTransform::operator()(const Normal3f &n, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(n);
    else if (time >= endTime)
        return endTransform(n);
    Transform t = Interpolate(time);
    return t(n);
}